

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vtls.c
# Opt level: O0

CURLcode blobdup(curl_blob **dest,curl_blob *src)

{
  curl_blob *pcVar1;
  curl_blob *d;
  curl_blob *src_local;
  curl_blob **dest_local;
  
  if (src != (curl_blob *)0x0) {
    pcVar1 = (curl_blob *)(*Curl_cmalloc)(src->len + 0x18);
    if (pcVar1 == (curl_blob *)0x0) {
      return CURLE_OUT_OF_MEMORY;
    }
    pcVar1->len = src->len;
    pcVar1->flags = 1;
    pcVar1->data = pcVar1 + 1;
    memcpy(pcVar1->data,src->data,src->len);
    *dest = pcVar1;
  }
  return CURLE_OK;
}

Assistant:

static CURLcode blobdup(struct curl_blob **dest,
                        struct curl_blob *src)
{
  DEBUGASSERT(dest);
  DEBUGASSERT(!*dest);
  if(src) {
    /* only if there's data to dupe! */
    struct curl_blob *d;
    d = malloc(sizeof(struct curl_blob) + src->len);
    if(!d)
      return CURLE_OUT_OF_MEMORY;
    d->len = src->len;
    /* Always duplicate because the connection may survive longer than the
       handle that passed in the blob. */
    d->flags = CURL_BLOB_COPY;
    d->data = (void *)((char *)d + sizeof(struct curl_blob));
    memcpy(d->data, src->data, src->len);
    *dest = d;
  }
  return CURLE_OK;
}